

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_connect_timeout.c
# Opt level: O0

int main(int argc,char **argv)

{
  undefined8 uVar1;
  amqp_rpc_reply_t x;
  amqp_rpc_reply_t x_00;
  int iVar2;
  long *plVar3;
  undefined8 uVar4;
  long lVar5;
  long in_RSI;
  int in_EDI;
  timeval *tv;
  amqp_connection_state_t conn;
  amqp_socket_t *socket;
  int port;
  char *hostname;
  undefined8 in_stack_ffffffffffffff68;
  uint uVar6;
  char *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  int iVar7;
  undefined1 local_78 [16];
  char *local_68;
  char *in_stack_ffffffffffffffa0;
  undefined1 local_58 [8];
  undefined8 in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  int local_4;
  
  uVar6 = (uint)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  iVar7 = (int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  if (in_EDI < 3) {
    fprintf(_stderr,"Usage: amqp_connect_timeout host port [timeout_sec [timeout_usec=0]]\n");
    local_4 = 1;
  }
  else {
    if (in_EDI < 4) {
      plVar3 = (long *)0x0;
    }
    else {
      plVar3 = (long *)malloc(0x10);
      iVar2 = atoi(*(char **)(in_RSI + 0x18));
      *plVar3 = (long)iVar2;
      if (in_EDI < 5) {
        plVar3[1] = 0;
      }
      else {
        iVar2 = atoi(*(char **)(in_RSI + 0x20));
        plVar3[1] = (long)iVar2;
      }
    }
    uVar1 = *(undefined8 *)(in_RSI + 8);
    iVar2 = atoi(*(char **)(in_RSI + 0x10));
    uVar4 = amqp_new_connection();
    lVar5 = amqp_tcp_socket_new(uVar4);
    if (lVar5 == 0) {
      die("creating TCP socket");
    }
    amqp_socket_open_noblock(lVar5,uVar1,iVar2,plVar3);
    die_on_error(iVar7,in_stack_ffffffffffffff78);
    amqp_login(local_58,uVar4,"/",0,0x20000,0,(ulong)uVar6 << 0x20,"guest","guest");
    x.reply._0_8_ = in_stack_ffffffffffffffb8;
    x._0_8_ = in_stack_ffffffffffffffb0;
    x.reply.decoded = (void *)in_stack_ffffffffffffffc0;
    x._24_8_ = plVar3;
    die_on_amqp_error(x,in_stack_ffffffffffffffa0);
    amqp_connection_close(local_78,uVar4,200);
    x_00.reply._0_8_ = in_stack_ffffffffffffffb8;
    x_00._0_8_ = in_stack_ffffffffffffffb0;
    x_00.reply.decoded = (void *)in_stack_ffffffffffffffc0;
    x_00._24_8_ = plVar3;
    die_on_amqp_error(x_00,in_stack_ffffffffffffffa0);
    iVar7 = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
    amqp_destroy_connection(uVar4);
    die_on_error(iVar7,local_68);
    printf("Done\n");
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int main(int argc, char const *const *argv)
{
  char const *hostname;
  int port;
  amqp_socket_t *socket;
  amqp_connection_state_t conn;
  struct timeval *tv;

  if (argc < 3) {
    fprintf(stderr, "Usage: amqp_connect_timeout host port [timeout_sec [timeout_usec=0]]\n");
    return 1;
  }

  if (argc > 3) {
    tv = malloc(sizeof(struct timeval));

    tv->tv_sec = atoi(argv[3]);

    if (argc > 4 ) {
      tv->tv_usec = atoi(argv[4]);
    } else {
      tv->tv_usec = 0;
    }

  } else {
    tv = NULL;
  }


  hostname = argv[1];
  port = atoi(argv[2]);

  conn = amqp_new_connection();

  socket = amqp_tcp_socket_new(conn);

  if (!socket) {
    die("creating TCP socket");
  }

  die_on_error(amqp_socket_open_noblock(socket, hostname, port, tv), "opening TCP socket");

  die_on_amqp_error(amqp_login(conn, "/", 0, 131072, 0, AMQP_SASL_METHOD_PLAIN, "guest", "guest"), "Logging in");

  die_on_amqp_error(amqp_connection_close(conn, AMQP_REPLY_SUCCESS), "Closing connection");
  die_on_error(amqp_destroy_connection(conn), "Ending connection");

  printf ("Done\n");
  return 0;
}